

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<DataStream,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  pointer puVar1;
  value_type_conflict3 *elem;
  pointer puVar2;
  long in_FS_OFFSET;
  uint local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<DataStream>
            (s,(long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2);
  puVar2 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    do {
      local_34 = *puVar2;
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
                 (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_34,&local_30);
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }